

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturnStringAsBlob(JsonString *pStr)

{
  long in_FS_OFFSET;
  JsonParse local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.bJsonIsRCStr = '\0';
  local_68.hasNonstd = '\0';
  local_68.bReadOnly = '\0';
  local_68.eEdit = '\0';
  local_68.delta = 0;
  local_68.nIns = 0;
  local_68.iLabel = 0;
  local_68.nJson = 0;
  local_68.nJPRef = 0;
  local_68.iErr = 0;
  local_68.iDepth = 0;
  local_68.nErr = '\0';
  local_68.oom = '\0';
  local_68.zJson = (char *)0x0;
  local_68.db = (sqlite3 *)0x0;
  local_68.aBlob = (u8 *)0x0;
  local_68.nBlob = 0;
  local_68.nBlobAlloc = 0;
  local_68.aIns = (u8 *)0x0;
  jsonStringTerminate(pStr);
  if (pStr->eErr == '\0') {
    local_68.zJson = pStr->zBuf;
    local_68.nJson = (int)pStr->nUsed;
    local_68.db = pStr->pCtx->pOut->db;
    jsonTranslateTextToBlob(&local_68,0);
    if (local_68.oom == '\0') {
      sqlite3_result_blob(pStr->pCtx,local_68.aBlob,local_68.nBlob,sqlite3OomClear);
    }
    else {
      sqlite3DbFree(local_68.db,local_68.aBlob);
      sqlite3_result_error_nomem(pStr->pCtx);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    sqlite3_result_error_nomem(pStr->pCtx);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonReturnStringAsBlob(JsonString *pStr){
  JsonParse px;
  memset(&px, 0, sizeof(px));
  jsonStringTerminate(pStr);
  if( pStr->eErr ){
    sqlite3_result_error_nomem(pStr->pCtx);
    return;
  }
  px.zJson = pStr->zBuf;
  px.nJson = pStr->nUsed;
  px.db = sqlite3_context_db_handle(pStr->pCtx);
  (void)jsonTranslateTextToBlob(&px, 0);
  if( px.oom ){
    sqlite3DbFree(px.db, px.aBlob);
    sqlite3_result_error_nomem(pStr->pCtx);
  }else{
    assert( px.nBlobAlloc>0 );
    assert( !px.bReadOnly );
    sqlite3_result_blob(pStr->pCtx, px.aBlob, px.nBlob, SQLITE_DYNAMIC);
  }
}